

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

complex<double> * c8mat_test(int n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  undefined8 extraout_XMM0_Qa;
  double dVar5;
  complex<double> *local_a8;
  double local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [24];
  double local_58;
  double local_40;
  double pi;
  int j;
  int i;
  complex<double> I;
  double angle;
  complex<double> *a;
  int n_local;
  
  std::complex<double>::complex((complex<double> *)&j,0.0,1.0);
  local_40 = 3.141592653589793;
  uVar2 = (ulong)(n * n);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pcVar4 = (complex<double> *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_a8 = pcVar4;
    do {
      std::complex<double>::complex(local_a8,0.0,0.0);
      local_a8 = local_a8 + 1;
    } while (local_a8 != pcVar4 + uVar2);
  }
  for (pi._0_4_ = 0; pi._0_4_ < n; pi._0_4_ = pi._0_4_ + 1) {
    for (pi._4_4_ = 0; pi._4_4_ < n; pi._4_4_ = pi._4_4_ + 1) {
      dVar5 = (double)n;
      I._M_value._8_8_ = (local_40 * 2.0 * (double)(pi._4_4_ * pi._0_4_)) / dVar5;
      std::operator*((complex<double> *)&j,(double *)(I._M_value + 8));
      local_80._8_8_ = dVar5;
      std::exp<double>((complex<double> *)local_80);
      local_70._8_8_ = dVar5;
      local_88 = sqrt((double)n);
      std::operator/((complex<double> *)local_70,&local_88);
      *(undefined8 *)pcVar4[pi._4_4_ + pi._0_4_ * n]._M_value = extraout_XMM0_Qa;
      *(double *)((long)pcVar4[pi._4_4_ + pi._0_4_ * n]._M_value + 8) = dVar5;
      local_58 = dVar5;
    }
  }
  return pcVar4;
}

Assistant:

complex <double> *c8mat_test ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_TEST returns a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Output, complex <double> C8MAT_TEST[N*N], the matrix.
//
{
  complex <double> *a;
  double angle;
  complex <double> I = complex <double> ( 0.0, 1.0 );
  int i;
  int j;
  double pi = 3.141592653589793;

  a = new complex <double>[n*n];

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < n; i++ )
    {
      angle = 2.0 * pi * static_cast<double>(i * j) / static_cast<double>(n);

      a[i+j*n] = exp ( I * angle ) / sqrt ( static_cast<double>(n) );
    }
  }
  return a;
}